

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  constraint_t<QString> *pcVar1;
  undefined8 *puVar2;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  logic_error *plVar9;
  undefined8 *puVar10;
  string_t local_280;
  string local_268;
  string local_248;
  string_t local_228;
  qstring_wrapper_t local_210;
  qstring_wrapper_t local_1f8;
  qstring_wrapper_t local_1e0;
  qstring_wrapper_t local_1c8;
  qstring_wrapper_t local_1b0;
  qstring_wrapper_t local_198;
  qstring_wrapper_t local_180;
  string local_168;
  string local_148;
  string local_128;
  qstring_wrapper_t local_108;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_c8;
  string_t local_a8;
  string_t local_90;
  string_t local_78;
  string_t local_60;
  string_t local_48;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<QString> *)0x0) {
    iVar8 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&this->m_value);
    if ((char)iVar8 == '\0') {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x28);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Invalid value: \"","");
      qstring_trait_t::from_ascii(&local_228,&local_128);
      local_280.m_str.d.d = (this->m_value).d.d;
      local_280.m_str.d.ptr = (this->m_value).d.ptr;
      local_280.m_str.d.size = (this->m_value).d.size;
      if (local_280.m_str.d.d != (Data *)0x0) {
        LOCK();
        ((local_280.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_280.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      operator+(&local_210,&local_228,&local_280);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"\". Value must match to the constraint in tag \"","");
      qstring_trait_t::from_ascii(&local_60,&local_148);
      operator+(&local_1f8,&local_210,&local_60);
      operator+(&local_1e0,&local_1f8,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"\". In file \"","");
      qstring_trait_t::from_ascii(&local_78,&local_168);
      operator+(&local_1c8,&local_1e0,&local_78);
      operator+(&local_1b0,&local_1c8,&info->m_file_name);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"\" on line ","");
      qstring_trait_t::from_ascii(&local_90,&local_268);
      operator+(&local_198,&local_1b0,&local_90);
      qstring_trait_t::to_string(&local_a8,info->m_line_number);
      operator+(&local_180,&local_198,&local_a8);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,".","");
      qstring_trait_t::from_ascii(&local_48,&local_248);
      operator+(&local_c8,&local_180,&local_48);
      std::logic_error::logic_error(plVar9,"Please use desc() method of the exception.");
      *(undefined ***)plVar9 = &PTR__exception_t_00147670;
      *(undefined8 *)(plVar9 + 0x10) = 0;
      *(undefined8 *)(plVar9 + 0x18) = 0;
      *(undefined8 *)(plVar9 + 0x20) = 0;
      pcVar3 = *(char16_t **)(plVar9 + 0x18);
      uVar5 = local_c8.m_str.d.d._0_4_;
      uVar6 = local_c8.m_str.d.d._4_4_;
      local_c8.m_str.d.d = (Data *)0x0;
      *(undefined4 *)(plVar9 + 0x10) = uVar5;
      *(undefined4 *)(plVar9 + 0x14) = uVar6;
      *(undefined4 *)(plVar9 + 0x18) = local_c8.m_str.d.ptr._0_4_;
      *(undefined4 *)(plVar9 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
      qVar4 = *(qsizetype *)(plVar9 + 0x20);
      *(qsizetype *)(plVar9 + 0x20) = local_c8.m_str.d.size;
      local_c8.m_str.d.ptr = pcVar3;
      local_c8.m_str.d.size = qVar4;
      __cxa_throw(plVar9,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined != false) {
    iVar8 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    puVar10 = *(undefined8 **)CONCAT44(extraout_var,iVar8);
    puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar8))[1];
    do {
      if (puVar10 == puVar2) {
        return;
      }
      this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar10;
      if (this_00->m_is_mandatory == true) {
        bVar7 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
        if (!bVar7) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x28);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"Undefined child mandatory tag: \"","");
          qstring_trait_t::from_ascii(&local_228,&local_128);
          operator+(&local_210,&local_228,&this_00->m_name);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"\". Where parent is: \"","");
          qstring_trait_t::from_ascii(&local_280,&local_148);
          operator+(&local_1f8,&local_210,&local_280);
          operator+(&local_1e0,&local_1f8,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"\". In file \"","");
          qstring_trait_t::from_ascii(&local_60,&local_168);
          operator+(&local_1c8,&local_1e0,&local_60);
          operator+(&local_1b0,&local_1c8,&info->m_file_name);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"\" on line ","");
          qstring_trait_t::from_ascii(&local_78,&local_268);
          operator+(&local_198,&local_1b0,&local_78);
          qstring_trait_t::to_string(&local_90,info->m_line_number);
          operator+(&local_180,&local_198,&local_90);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,".","");
          qstring_trait_t::from_ascii(&local_a8,&local_248);
          operator+(&local_108,&local_180,&local_a8);
          std::logic_error::logic_error(plVar9,"Please use desc() method of the exception.");
          *(undefined ***)plVar9 = &PTR__exception_t_00147670;
          *(undefined8 *)(plVar9 + 0x10) = 0;
          *(undefined8 *)(plVar9 + 0x18) = 0;
          *(undefined8 *)(plVar9 + 0x20) = 0;
          pcVar3 = *(char16_t **)(plVar9 + 0x18);
          uVar5 = local_108.m_str.d.d._0_4_;
          uVar6 = local_108.m_str.d.d._4_4_;
          local_108.m_str.d.d = (Data *)0x0;
          *(undefined4 *)(plVar9 + 0x10) = uVar5;
          *(undefined4 *)(plVar9 + 0x14) = uVar6;
          *(undefined4 *)(plVar9 + 0x18) = local_108.m_str.d.ptr._0_4_;
          *(undefined4 *)(plVar9 + 0x1c) = local_108.m_str.d.ptr._4_4_;
          qVar4 = *(qsizetype *)(plVar9 + 0x20);
          *(qsizetype *)(plVar9 + 0x20) = local_108.m_str.d.size;
          local_108.m_str.d.ptr = pcVar3;
          local_108.m_str.d.size = qVar4;
          __cxa_throw(plVar9,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
      }
      puVar10 = puVar10 + 1;
    } while( true );
  }
  plVar9 = (logic_error *)__cxa_allocate_exception(0x28);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Undefined value of tag: \"","");
  qstring_trait_t::from_ascii(&local_1e0,&local_128);
  operator+(&local_1c8,&local_1e0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_1f8,&local_148);
  operator+(&local_1b0,&local_1c8,&local_1f8);
  operator+(&local_198,&local_1b0,&info->m_file_name);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"\" on line ","");
  qstring_trait_t::from_ascii(&local_210,&local_168);
  operator+(&local_180,&local_198,&local_210);
  qstring_trait_t::to_string(&local_228,info->m_line_number);
  operator+((qstring_wrapper_t *)&local_248,&local_180,&local_228);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,".","");
  qstring_trait_t::from_ascii(&local_280,&local_268);
  operator+(&local_e8,(qstring_wrapper_t *)&local_248,&local_280);
  std::logic_error::logic_error(plVar9,"Please use desc() method of the exception.");
  *(undefined ***)plVar9 = &PTR__exception_t_00147670;
  *(undefined8 *)(plVar9 + 0x10) = 0;
  *(undefined8 *)(plVar9 + 0x18) = 0;
  *(undefined8 *)(plVar9 + 0x20) = 0;
  pcVar3 = *(char16_t **)(plVar9 + 0x18);
  uVar5 = local_e8.m_str.d.d._0_4_;
  uVar6 = local_e8.m_str.d.d._4_4_;
  local_e8.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(plVar9 + 0x10) = uVar5;
  *(undefined4 *)(plVar9 + 0x14) = uVar6;
  *(undefined4 *)(plVar9 + 0x18) = local_e8.m_str.d.ptr._0_4_;
  *(undefined4 *)(plVar9 + 0x1c) = local_e8.m_str.d.ptr._4_4_;
  qVar4 = *(qsizetype *)(plVar9 + 0x20);
  *(qsizetype *)(plVar9 + 0x20) = local_e8.m_str.d.size;
  local_e8.m_str.d.ptr = pcVar3;
  local_e8.m_str.d.size = qVar4;
  __cxa_throw(plVar9,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t( m_value ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}